

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printVar(JSPrinter *this,Ref node)

{
  size_t sVar1;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  Value *local_38;
  Ref node_local;
  Ref args;
  
  local_38 = node.inst;
  emit(this,"var ");
  plVar3 = (long *)cashew::Ref::operator[]((uint)&local_38);
  node_local.inst = (Value *)*plVar3;
  if ((node_local.inst)->type == Array) {
    uVar6 = 0;
    do {
      if (((((node_local.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar6) {
        return;
      }
      if (uVar6 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
      }
      uVar5 = (uint)&node_local;
      uVar2 = cashew::Ref::operator[](uVar5);
      puVar4 = (undefined8 *)cashew::Ref::operator[](uVar2);
      if (*(int *)*puVar4 != 0) {
        __assert_fail("isString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0xec,"const char *cashew::Value::getCString()");
      }
      emit(this,*(char **)((int *)*puVar4 + 4));
      puVar4 = (undefined8 *)cashew::Ref::operator[](uVar5);
      if (*(int *)*puVar4 != 2) break;
      if (1 < *(ulong *)(*(long *)((int *)*puVar4 + 2) + 8)) {
        space(this);
        maybeSpace(this,'=');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '=';
        space(this);
        uVar2 = cashew::Ref::operator[](uVar5);
        puVar4 = (undefined8 *)cashew::Ref::operator[](uVar2);
        print(this,(Value *)*puVar4);
      }
      uVar6 = uVar6 + 1;
    } while ((node_local.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x19a,"size_t cashew::Value::size()");
}

Assistant:

void printVar(Ref node) {
    emit("var ");
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i][0]->getCString());
      if (args[i]->size() > 1) {
        space();
        emit('=');
        space();
        print(args[i][1]);
      }
    }
  }